

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_PolyEdgeHistoryValue::WriteHelper(ON_PolyEdgeHistoryValue *this,ON_BinaryArchive *archive)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  bVar3 = false;
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar2) {
    bVar2 = ON_BinaryArchive::WriteInt(archive,(this->m_value).m_count);
    if (bVar2) {
      iVar1 = (this->m_value).m_count;
      bVar2 = true;
      lVar4 = 0;
      lVar5 = 0;
      while ((lVar5 < iVar1 && (bVar2 != false))) {
        bVar2 = ON_PolyEdgeHistory::Write
                          ((ON_PolyEdgeHistory *)(((this->m_value).m_a)->m_reserved + lVar4 + -0x34)
                           ,archive);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x78;
      }
    }
    else {
      bVar2 = false;
    }
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool ON_PolyEdgeHistoryValue::WriteHelper(ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;

  for(;;)
  {
    rc = archive.WriteInt(m_value.Count());
    if (!rc) break;
    
    int i, count = m_value.Count();
    for( i = 0; i < count && rc; i++ )
    {
      rc = m_value[i].Write(archive);
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}